

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindow::setWidget(QMdiSubWindow *this,QWidget *widget)

{
  QMdiSubWindowPrivate *this_00;
  Data *pDVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  bool bVar5;
  bool mod;
  bool bVar6;
  char cVar7;
  byte bVar8;
  QWidget *pQVar9;
  QLayout *this_01;
  QObject *pQVar10;
  Data *pDVar11;
  long lVar12;
  int __sig;
  long in_FS_OFFSET;
  QLatin1String QVar14;
  undefined1 local_70 [8];
  undefined1 local_68 [16];
  qsizetype local_58;
  QString local_50;
  long local_38;
  QMdiSubWindow *pQVar13;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if (widget == (QWidget *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QMdiSubWindowPrivate::removeBaseWidget(this_00);
      return;
    }
  }
  else {
    pDVar1 = (this_00->baseWidget).wp.d;
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar9 = (QWidget *)0x0;
    }
    else {
      pQVar9 = (QWidget *)(this_00->baseWidget).wp.value;
    }
    if (pQVar9 == widget) {
      setWidget();
    }
    else {
      bVar5 = QWidget::testAttribute_helper(&this->super_QWidget,WA_Resized);
      QMdiSubWindowPrivate::removeBaseWidget(this_00);
      this_01 = QWidget::layout(&this->super_QWidget);
      if (this_01 == (QLayout *)0x0) {
        QWidget::setParent(widget,&this->super_QWidget);
      }
      else {
        QLayout::addWidget(this_01,widget);
      }
      __sig = 0;
      pQVar10 = (QObject *)qt_qFindChild_helper(widget,0,0,&QSizeGrip::staticMetaObject,1);
      if (pQVar10 != (QObject *)0x0) {
        pQVar13 = this;
        QObject::installEventFilter(pQVar10);
        __sig = (int)pQVar13;
      }
      pDVar1 = (this_00->sizeGrip).wp.d;
      if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
         ((this_00->sizeGrip).wp.value != (QObject *)0x0)) {
        QWidget::raise((QWidget *)(this_00->sizeGrip).wp.value,__sig);
      }
      pDVar11 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&widget->super_QObject);
      pDVar1 = (this_00->baseWidget).wp.d;
      (this_00->baseWidget).wp.d = pDVar11;
      (this_00->baseWidget).wp.value = &widget->super_QObject;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar1 = *(int *)pDVar1 + -1;
        UNLOCK();
        if (*(int *)pDVar1 == 0) {
          operator_delete(pDVar1);
        }
      }
      QObject::installEventFilter((this_00->baseWidget).wp.value);
      this_00->ignoreWindowTitleChange = true;
      mod = QWidget::isWindowModified(&this->super_QWidget);
      QWidget::windowTitle(&local_50,&this->super_QWidget);
      if ((QWidgetData *)local_50.d.d != (QWidgetData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_50.d.size == 0) {
        QMdiSubWindowPrivate::updateWindowTitle(this_00,true);
        mod = QWidget::isWindowModified((QWidget *)(this_00->baseWidget).wp.value);
      }
      bVar6 = QWidget::isWindowModified(&this->super_QWidget);
      if (mod == true && !bVar6) {
        QWidget::windowTitle(&local_50,&this->super_QWidget);
        QVar14.m_data = (char *)0x3;
        QVar14.m_size = (qsizetype)&local_50;
        lVar12 = QString::indexOf(QVar14,0x6747ec,CaseInsensitive);
        bVar6 = lVar12 != -1;
        if ((QWidgetData *)local_50.d.d != (QWidgetData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        bVar6 = false;
      }
      if (bVar6) {
        QWidget::setWindowModified(&this->super_QWidget,mod);
      }
      QWidget::windowTitle((QString *)local_68,(QWidget *)(this_00->baseWidget).wp.value);
      pQVar2 = &((this_00->lastChildWindowTitle).d.d)->super_QArrayData;
      pcVar3 = (this_00->lastChildWindowTitle).d.ptr;
      (this_00->lastChildWindowTitle).d.d = (Data *)local_68._0_8_;
      (this_00->lastChildWindowTitle).d.ptr = (char16_t *)local_68._8_8_;
      qVar4 = (this_00->lastChildWindowTitle).d.size;
      (this_00->lastChildWindowTitle).d.size = local_58;
      local_68._0_8_ = pQVar2;
      local_68._8_8_ = pcVar3;
      local_58 = qVar4;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      this_00->ignoreWindowTitleChange = false;
      QWidget::windowIcon((QWidget *)local_68);
      cVar7 = QIcon::isNull();
      if (cVar7 == '\0') {
        bVar8 = 0;
      }
      else {
        QWidget::windowIcon((QWidget *)local_70);
        bVar8 = QIcon::isNull();
        bVar8 = bVar8 ^ 1;
        QIcon::~QIcon((QIcon *)local_70);
      }
      QIcon::~QIcon((QIcon *)local_68);
      if (bVar8 != 0) {
        QWidget::windowIcon((QWidget *)local_68);
        QWidget::setWindowIcon(&this->super_QWidget,(QIcon *)local_68);
        QIcon::~QIcon((QIcon *)local_68);
      }
      QMdiSubWindowPrivate::updateGeometryConstraints(this_00);
      if ((!bVar5) &&
         (bVar5 = QWidget::testAttribute_helper(&this->super_QWidget,WA_Resized), bVar5)) {
        QWidget::setAttribute(&this->super_QWidget,WA_Resized,false);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::setWidget(QWidget *widget)
{
    Q_D(QMdiSubWindow);
    if (!widget) {
        d->removeBaseWidget();
        return;
    }

    if (Q_UNLIKELY(widget == d->baseWidget)) {
        qWarning("QMdiSubWindow::setWidget: widget is already set");
        return;
    }

    bool wasResized = testAttribute(Qt::WA_Resized);
    d->removeBaseWidget();

    if (QLayout *layout = this->layout())
        layout->addWidget(widget);
    else
        widget->setParent(this);

#if QT_CONFIG(sizegrip)
    QSizeGrip *sizeGrip = widget->findChild<QSizeGrip *>();
    if (sizeGrip)
        sizeGrip->installEventFilter(this);
    if (d->sizeGrip)
        d->sizeGrip->raise();
#endif

    d->baseWidget = widget;
    d->baseWidget->installEventFilter(this);

    d->ignoreWindowTitleChange = true;
    bool isWindowModified = this->isWindowModified();
    if (windowTitle().isEmpty()) {
        d->updateWindowTitle(true);
        isWindowModified = d->baseWidget->isWindowModified();
    }
    if (!this->isWindowModified() && isWindowModified && windowTitle().contains("[*]"_L1))
        setWindowModified(isWindowModified);
    d->lastChildWindowTitle = d->baseWidget->windowTitle();
    d->ignoreWindowTitleChange = false;

    if (windowIcon().isNull() && !d->baseWidget->windowIcon().isNull())
        setWindowIcon(d->baseWidget->windowIcon());

    d->updateGeometryConstraints();
    if (!wasResized && testAttribute(Qt::WA_Resized))
        setAttribute(Qt::WA_Resized, false);
}